

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::NetStateRule::MergePartialFromCodedStream(NetStateRule *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  InternalMetadataWithArena *this_02;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  Arena *pAVar5;
  bool bVar6;
  uint32 uVar7;
  string *psVar8;
  Type *pTVar9;
  int64 iVar10;
  char *field_name;
  UnknownFieldSet *pUVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  pointer data;
  Rep *pRVar16;
  
  this_00 = &this->not_stage_;
  this_01 = &this->stage_;
  this_02 = &this->_internal_metadata_;
LAB_003acf29:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003acf4c;
      input->buffer_ = pbVar3 + 1;
      uVar14 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003acf4c:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar14 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar7 | uVar14;
    }
    uVar13 = (uint)uVar14;
    if ((uVar14 & 0x100000000) != 0) {
      cVar12 = (char)uVar14;
      switch((uint)(uVar14 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar12 == '\b') {
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar1 = *pbVar3;
            uVar7 = (uint32)bVar1;
            uVar13 = (uint)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ad2d3;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ad2d3:
            iVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            uVar13 = (uint)iVar10;
            if (iVar10 < 0) {
              return false;
            }
          }
          if (uVar13 < 2) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
            this->phase_ = uVar13;
          }
          else {
            pvVar4 = (this_02->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar4 & 1) == 0) {
              pUVar11 = google::protobuf::internal::
                        InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        ::mutable_unknown_fields_slow
                                  (&this_02->
                                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                  );
            }
            else {
              pUVar11 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
            }
            google::protobuf::UnknownFieldSet::AddVarint(pUVar11,1,(long)(int)uVar13);
          }
          goto LAB_003acf29;
        }
        break;
      case 2:
        if (cVar12 == '\x10') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar1 = *pbVar3;
            uVar14 = (ulong)bVar1;
            uVar7 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ad317;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ad317:
            uVar14 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            if ((long)uVar14 < 0) {
              return false;
            }
          }
          this->min_level_ = (int32)uVar14;
          goto LAB_003acf29;
        }
        break;
      case 3:
        if (cVar12 == '\x18') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar1 = *pbVar3;
            uVar14 = (ulong)bVar1;
            uVar7 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ad2b9;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ad2b9:
            uVar14 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            if ((long)uVar14 < 0) {
              return false;
            }
          }
          this->max_level_ = (int32)uVar14;
          goto LAB_003acf29;
        }
        break;
      case 4:
        if (cVar12 == '\"') {
          pRVar16 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar16 == (Rep *)0x0) {
            iVar15 = (this->stage_).super_RepeatedPtrFieldBase.total_size_;
LAB_003ad147:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&this_01->super_RepeatedPtrFieldBase,iVar15 + 1);
            pRVar16 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
            iVar15 = pRVar16->allocated_size;
LAB_003ad159:
            pRVar16->allocated_size = iVar15 + 1;
            pAVar5 = (this_01->super_RepeatedPtrFieldBase).arena_;
            if (pAVar5 == (Arena *)0x0) {
              psVar8 = (string *)operator_new(0x20);
              (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
              psVar8->_M_string_length = 0;
              (psVar8->field_2)._M_local_buf[0] = '\0';
            }
            else {
              psVar8 = (string *)
                       google::protobuf::Arena::AllocateAligned
                                 (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
              psVar8->_M_string_length = 0;
              (psVar8->field_2)._M_local_buf[0] = '\0';
              google::protobuf::Arena::AddListNode
                        (pAVar5,psVar8,
                         google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
              pRVar16 = (this->stage_).super_RepeatedPtrFieldBase.rep_;
            }
            iVar15 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
            (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
            pRVar16->elements[iVar15] = psVar8;
          }
          else {
            iVar2 = (this->stage_).super_RepeatedPtrFieldBase.current_size_;
            iVar15 = pRVar16->allocated_size;
            if (iVar15 <= iVar2) {
              if (iVar15 == (this->stage_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_003ad147;
              goto LAB_003ad159;
            }
            (this->stage_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar8 = (string *)pRVar16->elements[iVar2];
          }
          bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar8);
          if (!bVar6) {
            return false;
          }
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_01->super_RepeatedPtrFieldBase,
                              (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          data = (pTVar9->_M_dataplus)._M_p;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_01->super_RepeatedPtrFieldBase,
                              (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          iVar15 = (int)pTVar9->_M_string_length;
          field_name = "caffe.NetStateRule.stage";
LAB_003ad291:
          google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,iVar15,PARSE,field_name)
          ;
          goto LAB_003acf29;
        }
        break;
      case 5:
        if (cVar12 == '*') {
          pRVar16 = (this->not_stage_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar16 == (Rep *)0x0) {
            iVar15 = (this->not_stage_).super_RepeatedPtrFieldBase.total_size_;
LAB_003ad0d8:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&this_00->super_RepeatedPtrFieldBase,iVar15 + 1);
            pRVar16 = (this->not_stage_).super_RepeatedPtrFieldBase.rep_;
            iVar15 = pRVar16->allocated_size;
LAB_003ad0ea:
            pRVar16->allocated_size = iVar15 + 1;
            pAVar5 = (this_00->super_RepeatedPtrFieldBase).arena_;
            if (pAVar5 == (Arena *)0x0) {
              psVar8 = (string *)operator_new(0x20);
              (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
              psVar8->_M_string_length = 0;
              (psVar8->field_2)._M_local_buf[0] = '\0';
            }
            else {
              psVar8 = (string *)
                       google::protobuf::Arena::AllocateAligned
                                 (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
              psVar8->_M_string_length = 0;
              (psVar8->field_2)._M_local_buf[0] = '\0';
              google::protobuf::Arena::AddListNode
                        (pAVar5,psVar8,
                         google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
              pRVar16 = (this->not_stage_).super_RepeatedPtrFieldBase.rep_;
            }
            iVar15 = (this->not_stage_).super_RepeatedPtrFieldBase.current_size_;
            (this->not_stage_).super_RepeatedPtrFieldBase.current_size_ = iVar15 + 1;
            pRVar16->elements[iVar15] = psVar8;
          }
          else {
            iVar2 = (this->not_stage_).super_RepeatedPtrFieldBase.current_size_;
            iVar15 = pRVar16->allocated_size;
            if (iVar15 <= iVar2) {
              if (iVar15 == (this->not_stage_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_003ad0d8;
              goto LAB_003ad0ea;
            }
            (this->not_stage_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            psVar8 = (string *)pRVar16->elements[iVar2];
          }
          bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar8);
          if (!bVar6) {
            return false;
          }
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->not_stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          data = (pTVar9->_M_dataplus)._M_p;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,
                              (this->not_stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
          iVar15 = (int)pTVar9->_M_string_length;
          field_name = "caffe.NetStateRule.not_stage";
          goto LAB_003ad291;
        }
      }
    }
    if (uVar13 == 0) {
      return true;
    }
    if ((uVar13 & 7) == 4) {
      return true;
    }
    pvVar4 = (this_02->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      pUVar11 = google::protobuf::internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_02->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar11 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar6 = google::protobuf::internal::WireFormat::SkipField(input,uVar13,pUVar11);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetStateRule::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetStateRule)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.Phase phase = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 min_level = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_min_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &min_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 max_level = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_max_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &max_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string stage = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->stage(this->stage_size() - 1).data(),
            this->stage(this->stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string not_stage = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_not_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->not_stage(this->not_stage_size() - 1).data(),
            this->not_stage(this->not_stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.not_stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetStateRule)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetStateRule)
  return false;
#undef DO_
}